

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O2

ssize_t __thiscall
BuildsMetaMakefileGenerator::write
          (BuildsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  QList<BuildsMetaMakefileGenerator::Build_*> *this_00;
  Build *dst;
  QMakeProject *this_01;
  QMAKE_MODE QVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  FILE *__stream;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  iterator iVar9;
  parameter_type t;
  MakefileGenerator *pMVar10;
  pointer ppBVar11;
  byte bVar12;
  undefined7 uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e0;
  ProKey local_c8;
  ProString local_98;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->makefiles;
  if ((this->makefiles).d.size == 0) {
    t = (Build *)0x0;
  }
  else {
    iVar9 = QList<BuildsMetaMakefileGenerator::Build_*>::begin(this_00);
    t = (Build *)0x0;
    if ((((*iVar9.i)->build).d.ptr != (char16_t *)0x0) && (Option::qmake_mode != QMAKE_GENERATE_PRL)
       ) {
      t = (parameter_type)operator_new(0x38);
      (t->name).d.d = (Data *)0x0;
      (t->name).d.ptr = (char16_t *)0x0;
      (t->name).d.size = 0;
      (t->build).d.d = (Data *)0x0;
      (t->build).d.ptr = (char16_t *)0x0;
      (t->build).d.size = 0;
      QString::operator=((QString *)t,(QString *)&(this->super_MetaMakefileGenerator).name);
      pMVar10 = MetaMakefileGenerator::createMakefileGenerator
                          ((this->super_MetaMakefileGenerator).project,true);
      t->makefile = pMVar10;
      QList<BuildsMetaMakefileGenerator::Build_*>::append(this_00,t);
    }
  }
  QFile::fileName();
  uVar8 = 1;
  for (uVar14 = 0; ((uVar8 & 1) != 0 && (uVar14 < (ulong)(this->makefiles).d.size));
      uVar14 = uVar14 + 1) {
    QFile::setFileName((QString *)Option::output);
    ppBVar11 = QList<BuildsMetaMakefileGenerator::Build_*>::data(this_00);
    dst = ppBVar11[uVar14];
    if (dst->makefile == (MakefileGenerator *)0x0) {
      uVar8 = 0;
    }
    else {
      bVar6 = true;
      if (Option::qmake_mode - QMAKE_GENERATE_PROJECT < 2) {
        iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
        if ((char)iVar7 != '\0') {
          iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
          bVar6 = true;
          if (((char)iVar7 == '\0') || (bVar6 = true, t != (Build *)0x0 && dst != t))
          goto LAB_0016c159;
        }
        cVar5 = QIODevice::isOpen();
        if (cVar5 == '\0') {
          QFile::fileName();
          bVar6 = comparesEqual(&local_98.m_string,"-");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
          if (bVar6) {
            QString::QString(&local_98.m_string,"");
            QFile::setFileName((QString *)Option::output);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            qmake_getpwd();
            qVar4 = Option::output_dir.d.size;
            pcVar3 = Option::output_dir.d.ptr;
            pDVar2 = Option::output_dir.d.d;
            Option::output_dir.d.d = local_98.m_string.d.d;
            Option::output_dir.d.ptr = local_98.m_string.d.ptr;
            local_98.m_string.d.d = pDVar2;
            local_98.m_string.d.ptr = pcVar3;
            Option::output_dir.d.size = local_98.m_string.d.size;
            local_98.m_string.d.size = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            cVar5 = QFile::open(Option::output,_stdout,0x12,0);
            bVar6 = true;
            if (cVar5 == '\0') {
              fwrite("Failure to open stdout\n",0x17,1,_stderr);
LAB_0016c385:
              bVar12 = 0;
              uVar13 = 0;
              goto LAB_0016c27e;
            }
          }
          else {
            QFile::fileName();
            qVar4 = local_98.m_string.d.size;
            QVar1 = Option::qmake_mode;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            if ((qVar4 == 0) && (QVar1 == QMAKE_GENERATE_MAKEFILE)) {
              this_01 = (this->super_MetaMakefileGenerator).project;
              ProKey::ProKey(&local_c8,"QMAKE_MAKEFILE");
              QMakeEvaluator::first(&local_98,&this_01->super_QMakeEvaluator,&local_c8);
              ProString::toQString((QString *)&local_68,&local_98);
              QFile::setFileName((QString *)Option::output);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_c8);
            }
            local_98.m_string.d.d = (dst->name).d.d;
            local_98.m_string.d.ptr = (dst->name).d.ptr;
            local_98.m_string.d.size = (dst->name).d.size;
            if (local_98.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if ((dst->build).d.size != 0) {
              if (local_98.m_string.d.size != 0) {
                QString::operator+=(&local_98.m_string,".");
              }
              QString::append((QString *)&local_98);
            }
            iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1f])
                              (dst->makefile,Option::output,&local_98);
            __stream = _stderr;
            if ((char)iVar7 == '\0') {
              QFile::fileName();
              if (local_c8.super_ProString.m_string.d.size == 0) {
                fprintf(__stream,"Failure to open file: %s\n","(stdout)");
              }
              else {
                QFile::fileName();
                QString::toLatin1_helper_inplace((QString *)&local_68);
                if (local_68.ptr == (char16_t *)0x0) {
                  local_68.ptr = (char16_t *)&QByteArray::_empty;
                }
                fprintf(__stream,"Failure to open file: %s\n",local_68.ptr);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_98);
              goto LAB_0016c385;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_98);
            bVar6 = false;
          }
        }
        else {
          bVar6 = false;
        }
      }
LAB_0016c159:
      if (dst->makefile == (MakefileGenerator *)0x0) {
        uVar8 = 0;
      }
      else if (dst == t) {
        checkForConflictingTargets(this);
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_INTERNAL_INCLUDED_FILES");
        accumulateVariableFromBuilds(this,(ProKey *)&local_98,dst);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        uVar8 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1b])();
      }
      else {
        uVar8 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1a])();
        if ((t != (Build *)0x0) &&
           (iVar7 = (*(t->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])(),
           (char)iVar7 != '\0')) {
          uVar8 = (*(t->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1e])
                            (t->makefile,dst->makefile);
        }
      }
      if ((!bVar6) && (QFileDevice::close(), (char)uVar8 == '\0')) {
        QFile::remove();
      }
    }
  }
  uVar13 = (undefined7)((ulong)this >> 8);
  bVar12 = 1;
LAB_0016c27e:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CONCAT71(uVar13,bVar12 & (byte)uVar8) & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool
BuildsMetaMakefileGenerator::write()
{
    Build *glue = nullptr;
    if(!makefiles.isEmpty() && !makefiles.first()->build.isNull()
        && Option::qmake_mode != Option::QMAKE_GENERATE_PRL) {
        glue = new Build;
        glue->name = name;
        glue->makefile = createMakefileGenerator(project, true);
        makefiles += glue;
    }

    bool ret = true;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < makefiles.size(); i++) {
        Option::output.setFileName(output_name);
        Build *build = makefiles[i];

        bool using_stdout = false;
        if(build->makefile && (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                               Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
           && (!build->makefile->supportsMergedBuilds()
            || (build->makefile->supportsMergedBuilds() && (!glue || build == glue)))) {
            //open output
            if(!(Option::output.isOpen())) {
                if(Option::output.fileName() == "-") {
                    Option::output.setFileName("");
                    Option::output_dir = qmake_getpwd();
                    if (!Option::output.open(stdout, QIODevice::WriteOnly | QIODevice::Text)) {
                        fprintf(stderr, "Failure to open stdout\n");
                        return false;
                    }
                    using_stdout = true;
                } else {
                    if(Option::output.fileName().isEmpty() &&
                       Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE)
                        Option::output.setFileName(project->first("QMAKE_MAKEFILE").toQString());
                    QString build_name = build->name;
                    if(!build->build.isEmpty()) {
                        if(!build_name.isEmpty())
                            build_name += ".";
                        build_name += build->build;
                    }
                    if(!build->makefile->openOutput(Option::output, build_name)) {
                        fprintf(stderr, "Failure to open file: %s\n",
                                Option::output.fileName().isEmpty() ? "(stdout)" :
                                Option::output.fileName().toLatin1().constData());
                        return false;
                    }
                }
            }
        } else {
           using_stdout = true; //kind of..
        }

        if(!build->makefile) {
            ret = false;
        } else if(build == glue) {
            checkForConflictingTargets();
            accumulateVariableFromBuilds("QMAKE_INTERNAL_INCLUDED_FILES", build);
            ret = build->makefile->writeProjectMakefile();
        } else {
            ret = build->makefile->write();
            if (glue && glue->makefile->supportsMergedBuilds())
                ret = glue->makefile->mergeBuildProject(build->makefile);
        }
        if(!using_stdout) {
            Option::output.close();
            if(!ret)
                Option::output.remove();
        }
    }
    return ret;
}